

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getDHPublicKey
          (SoftHSM *this,DHPublicKey *publicKey,DHPrivateKey *privateKey,ByteString *pubParams)

{
  undefined8 uVar1;
  CK_RV CVar2;
  
  if (privateKey == (DHPrivateKey *)0x0 || publicKey == (DHPublicKey *)0x0) {
    CVar2 = 7;
  }
  else {
    uVar1 = (**(code **)(*(long *)privateKey + 0x60))(privateKey);
    (**(code **)(*(long *)publicKey + 0x30))(publicKey,uVar1);
    uVar1 = (**(code **)(*(long *)privateKey + 0x68))(privateKey);
    (**(code **)(*(long *)publicKey + 0x38))(publicKey,uVar1);
    (**(code **)(*(long *)publicKey + 0x40))(publicKey,pubParams);
    CVar2 = 0;
  }
  return CVar2;
}

Assistant:

CK_RV SoftHSM::getDHPublicKey(DHPublicKey* publicKey, DHPrivateKey* privateKey, ByteString& pubParams)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;

	// Copy Domain Parameters from Private Key
	publicKey->setP(privateKey->getP());
	publicKey->setG(privateKey->getG());

	// Set value
	publicKey->setY(pubParams);

	return CKR_OK;
}